

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfFlatImageChannel.h
# Opt level: O0

Slice * __thiscall Imf_2_5::TypedFlatImageChannel<float>::slice(TypedFlatImageChannel<float> *this)

{
  ImageLevel *b;
  PixelType t;
  int iVar1;
  int xsm;
  int ysm;
  ImageChannel *in_RSI;
  Slice *in_RDI;
  
  t = (**in_RSI->_vptr_ImageChannel)();
  b = in_RSI[1]._level;
  iVar1 = ImageChannel::pixelsPerRow(in_RSI);
  xsm = ImageChannel::xSampling(in_RSI);
  ysm = ImageChannel::ySampling(in_RSI);
  Slice::Slice(in_RDI,t,(char *)b,4,(long)iVar1 << 2,xsm,ysm,0.0,false,false);
  return in_RDI;
}

Assistant:

Slice
TypedFlatImageChannel<T>::slice () const
{
    return Slice (pixelType(),                 // type
                  (char *) _base,              // base
                  sizeof (T),                  // xStride
                  pixelsPerRow() * sizeof (T), // yStride
                  xSampling(),
                  ySampling());
}